

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

void __thiscall
vkt::sparse::anon_unknown_0::SparseBufferTestInstance::draw
          (SparseBufferTestInstance *this,VkPrimitiveTopology topology,
          VkDescriptorSetLayout descriptorSetLayout,SpecializationMap *specMap)

{
  deUint32 queueFamilyIndex;
  VkFormat colorFormat;
  Renderer *pRVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  Allocator *allocator;
  ProgramCollection<vk::ProgramBinary> *binaryCollection;
  Handle<(vk::HandleType)8> *pHVar4;
  DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer> local_10a;
  undefined1 local_109;
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  local_108;
  Vector<float,_4> local_d8;
  VkBuffer local_c8;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  VkDescriptorSetLayout local_60;
  undefined1 local_58 [8];
  UniquePtr<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  renderer;
  SpecializationMap *specMap_local;
  VkPrimitiveTopology topology_local;
  SparseBufferTestInstance *this_local;
  VkDescriptorSetLayout descriptorSetLayout_local;
  
  renderer.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  .m_data._8_8_ = specMap;
  pRVar1 = (Renderer *)operator_new(0x198);
  local_109 = 1;
  pDVar2 = SparseResourcesBaseInstance::getDeviceInterface(&this->super_SparseResourcesBaseInstance)
  ;
  pVVar3 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  allocator = SparseResourcesBaseInstance::getAllocator(&this->super_SparseResourcesBaseInstance);
  queueFamilyIndex = (this->m_universalQueue).queueFamilyIndex;
  local_60.m_internal = descriptorSetLayout.m_internal;
  binaryCollection =
       Context::getBinaryCollection
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"vert",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"frag",&local_b9);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_colorBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_c8.m_internal = pHVar4->m_internal;
  colorFormat = this->m_colorFormat;
  tcu::Vector<float,_4>::Vector(&local_d8,1.0,0.0,0.0,1.0);
  std::
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::map(&local_108,specMap);
  Renderer::Renderer(pRVar1,pDVar2,pVVar3,allocator,queueFamilyIndex,local_60,binaryCollection,
                     &local_90,&local_b8,local_c8,&this->m_renderSize,colorFormat,&local_d8,topology
                     ,&local_108);
  local_109 = 0;
  de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>::DefaultDeleter(&local_10a);
  de::details::
  UniquePtr<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  ::UniquePtr((UniquePtr<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
               *)local_58,pRVar1);
  std::
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~map(&local_108);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pRVar1 = de::details::
           UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
           ::operator->((UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
                         *)local_58);
  pDVar2 = SparseResourcesBaseInstance::getDeviceInterface(&this->super_SparseResourcesBaseInstance)
  ;
  pVVar3 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  Renderer::draw(pRVar1,pDVar2,pVVar3,(this->m_universalQueue).queueHandle,&this->super_Delegate);
  de::details::
  UniquePtr<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  ::~UniquePtr((UniquePtr<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
                *)local_58);
  return;
}

Assistant:

void draw (const VkPrimitiveTopology	topology,
			   const VkDescriptorSetLayout	descriptorSetLayout	= DE_NULL,
			   Renderer::SpecializationMap	specMap				= Renderer::SpecializationMap())
	{
		const UniquePtr<Renderer> renderer(new Renderer(
			getDeviceInterface(), getDevice(), getAllocator(), m_universalQueue.queueFamilyIndex, descriptorSetLayout,
			m_context.getBinaryCollection(), "vert", "frag", *m_colorBuffer, m_renderSize, m_colorFormat, Vec4(1.0f, 0.0f, 0.0f, 1.0f), topology, specMap));

		renderer->draw(getDeviceInterface(), getDevice(), m_universalQueue.queueHandle, *this);
	}